

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O3

void __thiscall cmCoreTryCompile::CleanupFiles(cmCoreTryCompile *this,string *binDir)

{
  pointer pcVar1;
  cmMakefile *this_00;
  _Alloc_hider _Var2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  unsigned_long uVar6;
  char *pcVar7;
  size_t sVar8;
  long *plVar9;
  long lVar10;
  size_type *psVar11;
  ulong dindex;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar12;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string fullPath;
  Directory dir;
  Status status;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  deletedFiles;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  undefined8 local_100;
  char *local_f8;
  size_type local_f0;
  pointer local_e8;
  string local_e0;
  Directory local_c0;
  cmCoreTryCompile *local_b8;
  string local_b0;
  string *local_90;
  Status local_88;
  string local_80;
  undefined1 local_60 [32];
  _Base_ptr local_40;
  size_t local_38;
  
  if (binDir->_M_string_length != 0) {
    local_b8 = this;
    bVar4 = IsTemporary(binDir);
    if (bVar4) {
      cmsys::Directory::Directory(&local_c0);
      cmsys::Directory::Load(&local_c0,binDir,(string *)0x0);
      local_60._24_8_ = local_60 + 8;
      local_60._8_4_ = _S_red;
      dindex = 0;
      local_60._16_8_ = 0;
      local_38 = 0;
      local_90 = binDir;
      local_40 = (_Base_ptr)local_60._24_8_;
      while( true ) {
        uVar6 = cmsys::Directory::GetNumberOfFiles(&local_c0);
        if (uVar6 <= dindex) break;
        pcVar7 = cmsys::Directory::GetFile(&local_c0,dindex);
        if ((*pcVar7 != '.') || ((pcVar7[1] != '\0' && ((pcVar7[1] != '.' || (pcVar7[2] != '\0')))))
           ) {
          local_120._M_dataplus._M_p = (pointer)strlen(pcVar7);
          __str._M_str = ".nfs";
          __str._M_len = 4;
          local_120._M_string_length = (size_type)pcVar7;
          iVar5 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                            ((basic_string_view<char,_std::char_traits<char>_> *)&local_120,0,4,
                             __str);
          if (iVar5 != 0) {
            local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
            sVar8 = strlen(pcVar7);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_120,pcVar7,pcVar7 + sVar8);
            pVar12 = std::
                     _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                     ::_M_insert_unique<std::__cxx11::string>
                               ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                 *)local_60,&local_120);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._M_dataplus._M_p != &local_120.field_2) {
              operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1
                             );
            }
            if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
              pcVar1 = (binDir->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_120,pcVar1,pcVar1 + binDir->_M_string_length);
              pcVar7 = (char *)std::__cxx11::string::append((char *)&local_120);
              plVar9 = (long *)std::__cxx11::string::append(pcVar7);
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_e0,*plVar9,plVar9[1] + *plVar9);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_120._M_dataplus._M_p != &local_120.field_2) {
                operator_delete(local_120._M_dataplus._M_p,
                                local_120.field_2._M_allocated_capacity + 1);
              }
              bVar4 = cmsys::SystemTools::FileIsSymlink(&local_e0);
              if (bVar4) {
                cmsys::SystemTools::RemoveFile(&local_e0);
              }
              else {
                bVar4 = cmsys::SystemTools::FileIsDirectory(&local_e0);
                if (bVar4) {
                  CleanupFiles(local_b8,&local_e0);
                  cmsys::SystemTools::RemoveADirectory(&local_e0);
                }
                else {
                  local_88 = cmsys::SystemTools::RemoveFile(&local_e0);
                  sVar3 = local_e0._M_string_length;
                  _Var2._M_p = local_e0._M_dataplus._M_p;
                  if (local_88.Kind_ != Success) {
                    this_00 = local_b8->Makefile;
                    cmsys::Status::GetString_abi_cxx11_(&local_b0,&local_88);
                    local_120._M_dataplus._M_p = (pointer)0xc;
                    local_120._M_string_length = 0x7ce301;
                    local_120.field_2._M_allocated_capacity = sVar3;
                    local_120.field_2._8_8_ = _Var2._M_p;
                    local_100 = 0x19;
                    local_f8 = "\ncould not be removed:\n  ";
                    local_f0 = local_b0._M_string_length;
                    local_e8 = local_b0._M_dataplus._M_p;
                    views._M_len = 4;
                    views._M_array = (iterator)&local_120;
                    cmCatViews_abi_cxx11_(&local_80,views);
                    cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_80);
                    binDir = local_90;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_80._M_dataplus._M_p != &local_80.field_2) {
                      operator_delete(local_80._M_dataplus._M_p,
                                      local_80.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                      operator_delete(local_b0._M_dataplus._M_p,
                                      local_b0.field_2._M_allocated_capacity + 1);
                    }
                  }
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1
                               );
              }
            }
          }
        }
        dindex = dindex + 1;
      }
      lVar10 = std::__cxx11::string::find((char *)binDir,0x791781,0);
      if (lVar10 != -1) {
        cmsys::SystemTools::RemoveADirectory(binDir);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_60);
      cmsys::Directory::~Directory(&local_c0);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                     "TRY_COMPILE attempt to remove -rf directory that does not contain CMakeTmp or CMakeScratch: \""
                     ,binDir);
      plVar9 = (long *)std::__cxx11::string::append((char *)local_60);
      psVar11 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_120.field_2._M_allocated_capacity = *psVar11;
        local_120.field_2._8_8_ = plVar9[3];
        local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      }
      else {
        local_120.field_2._M_allocated_capacity = *psVar11;
        local_120._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_120._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      cmSystemTools::Error(&local_120);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
        operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
      }
    }
  }
  return;
}

Assistant:

void cmCoreTryCompile::CleanupFiles(std::string const& binDir)
{
  if (binDir.empty()) {
    return;
  }

  if (!IsTemporary(binDir)) {
    cmSystemTools::Error(
      "TRY_COMPILE attempt to remove -rf directory that does not contain "
      "CMakeTmp or CMakeScratch: \"" +
      binDir + "\"");
    return;
  }

  cmsys::Directory dir;
  dir.Load(binDir);
  std::set<std::string> deletedFiles;
  for (unsigned long i = 0; i < dir.GetNumberOfFiles(); ++i) {
    const char* fileName = dir.GetFile(i);
    if (strcmp(fileName, ".") != 0 && strcmp(fileName, "..") != 0 &&
        // Do not delete NFS temporary files.
        !cmHasPrefix(fileName, ".nfs")) {
      if (deletedFiles.insert(fileName).second) {
        std::string const fullPath =
          std::string(binDir).append("/").append(fileName);
        if (cmSystemTools::FileIsSymlink(fullPath)) {
          cmSystemTools::RemoveFile(fullPath);
        } else if (cmSystemTools::FileIsDirectory(fullPath)) {
          this->CleanupFiles(fullPath);
          cmSystemTools::RemoveADirectory(fullPath);
        } else {
#ifdef _WIN32
          // Sometimes anti-virus software hangs on to new files so we
          // cannot delete them immediately.  Try a few times.
          cmSystemTools::WindowsFileRetry retry =
            cmSystemTools::GetWindowsFileRetry();
          cmsys::Status status;
          while (!((status = cmSystemTools::RemoveFile(fullPath))) &&
                 --retry.Count && cmSystemTools::FileExists(fullPath)) {
            cmSystemTools::Delay(retry.Delay);
          }
          if (retry.Count == 0)
#else
          cmsys::Status status = cmSystemTools::RemoveFile(fullPath);
          if (!status)
#endif
          {
            this->Makefile->IssueMessage(
              MessageType::FATAL_ERROR,
              cmStrCat("The file:\n  ", fullPath,
                       "\ncould not be removed:\n  ", status.GetString()));
          }
        }
      }
    }
  }

  if (binDir.find("CMakeScratch") != std::string::npos) {
    cmSystemTools::RemoveADirectory(binDir);
  }
}